

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::ConvertToGrayScale
                  (Image *__return_storage_ptr__,ConvertToGrayScaleForm4 convertToGrayScale,
                  Image *in)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*convertToGrayScale)
            (in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
             __return_storage_ptr__->_height);
  return __return_storage_ptr__;
}

Assistant:

Image ConvertToGrayScale( FunctionTable::ConvertToGrayScaleForm4 convertToGrayScale,
                              const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        convertToGrayScale( in, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }